

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

PrimitiveInstantiationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::PrimitiveInstantiationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::syntax::NetStrengthSyntax*&,slang::syntax::TimingControlSyntax*&,slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>const&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,NetStrengthSyntax **args_2,TimingControlSyntax **args_3,
          SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *args_4,Token *args_5)

{
  Token semi;
  Token type;
  PrimitiveInstantiationSyntax *pPVar1;
  PrimitiveInstantiationSyntax *in_RCX;
  long in_RDX;
  Info *in_RSI;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_R8;
  NetStrengthSyntax *in_R9;
  SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *unaff_retaddr;
  undefined8 in_stack_00000008;
  Info *in_stack_00000010;
  size_t in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  BumpAllocator *in_stack_ffffffffffffffa8;
  
  pPVar1 = (PrimitiveInstantiationSyntax *)
           allocate(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  type.info = in_RSI;
  type.kind = (short)in_RDX;
  type._2_1_ = (char)((ulong)in_RDX >> 0x10);
  type.numFlags.raw = (char)((ulong)in_RDX >> 0x18);
  type.rawLen = (int)((ulong)in_RDX >> 0x20);
  semi.info = in_stack_00000010;
  semi._0_8_ = in_stack_00000008;
  slang::syntax::PrimitiveInstantiationSyntax::PrimitiveInstantiationSyntax
            (in_RCX,in_R8,type,in_R9,*(TimingControlSyntax **)(in_RDX + 8),unaff_retaddr,semi);
  return pPVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }